

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multikey_cache.cpp
# Opt level: O1

void multikey_cache<8u,true>(Cacheblock<8U>_conflict *cache,size_t N,size_t depth)

{
  byte *pbVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  ulong uVar4;
  uchar *puVar5;
  uchar *puVar6;
  int iVar7;
  uint64_t uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  size_t i;
  ulong uVar12;
  ulong uVar13;
  Cacheblock<8U>_conflict *pCVar14;
  long lVar15;
  Cacheblock<8U>_conflict *pCVar16;
  Cacheblock<8U>_conflict *pCVar17;
  ulong uVar18;
  ulong uVar19;
  Cacheblock<8U>_conflict *pCVar20;
  byte bVar21;
  ulong uVar22;
  byte bVar23;
  size_t sVar24;
  ulong uVar25;
  long lVar26;
  long lVar27;
  ulong uVar28;
  ulong uVar29;
  
  lVar27 = depth + 1;
LAB_001b32ce:
  if (0x1f < N) {
    uVar12 = 0;
    do {
      lVar15 = 0x40;
      uVar19 = 0;
      sVar24 = depth;
      do {
        if (lVar15 == 0) break;
        pbVar1 = cache[uVar12].ptr + sVar24;
        lVar15 = lVar15 + -8;
        uVar19 = uVar19 | (ulong)*pbVar1 << ((byte)lVar15 & 0x3f);
        sVar24 = sVar24 + 1;
      } while ((ulong)*pbVar1 != 0);
      cache[uVar12].cached_bytes = uVar19;
      uVar12 = uVar12 + 1;
    } while (uVar12 != N);
    uVar13 = N >> 3;
    uVar12 = cache->cached_bytes;
    uVar19 = cache[uVar13].cached_bytes;
    pCVar14 = cache;
    if (uVar12 != uVar19) {
      pCVar14 = cache + (N >> 2);
      uVar25 = pCVar14->cached_bytes;
      if ((uVar25 != uVar12) && (uVar25 != uVar19)) {
        if (uVar12 < uVar19) {
          if (uVar25 <= uVar12) {
            pCVar14 = cache;
          }
          if (uVar19 < uVar25) {
            pCVar14 = cache + uVar13;
          }
        }
        else {
          if (uVar12 < uVar25) {
            pCVar14 = cache;
          }
          if (uVar25 < uVar19) {
            pCVar14 = cache + uVar13;
          }
        }
      }
    }
    uVar25 = N >> 1;
    pCVar16 = cache + (uVar25 - uVar13);
    uVar12 = cache[uVar25 - uVar13].cached_bytes;
    uVar19 = cache[uVar25].cached_bytes;
    pCVar17 = pCVar16;
    if (uVar12 != uVar19) {
      pCVar20 = cache + uVar25;
      pCVar17 = pCVar20 + uVar13;
      uVar25 = pCVar17->cached_bytes;
      if ((uVar25 != uVar12) && (uVar25 != uVar19)) {
        if (uVar12 < uVar19) {
          if (uVar12 < uVar25) {
            pCVar16 = pCVar17;
          }
          pCVar17 = pCVar16;
          if (uVar19 < uVar25) {
            pCVar17 = pCVar20;
          }
        }
        else {
          if (uVar12 < uVar25) {
            pCVar17 = pCVar16;
          }
          if (uVar25 < uVar19) {
            pCVar17 = pCVar20;
          }
        }
      }
    }
    lVar26 = (N - (N >> 2)) + -1;
    pCVar16 = cache + lVar26;
    lVar15 = (N - uVar13) + -1;
    uVar12 = cache[lVar26].cached_bytes;
    uVar19 = cache[lVar15].cached_bytes;
    pCVar20 = pCVar16;
    if (uVar12 != uVar19) {
      pCVar20 = cache + (N - 3);
      uVar13 = pCVar20->cached_bytes;
      if ((uVar13 != uVar12) && (uVar13 != uVar19)) {
        if (uVar12 < uVar19) {
          if (uVar12 < uVar13) {
            pCVar16 = pCVar20;
          }
          pCVar20 = pCVar16;
          if (uVar19 < uVar13) {
            pCVar20 = cache + lVar15;
          }
        }
        else {
          if (uVar12 < uVar13) {
            pCVar20 = pCVar16;
          }
          if (uVar13 < uVar19) {
            pCVar20 = cache + lVar15;
          }
        }
      }
    }
    uVar12 = pCVar14->cached_bytes;
    uVar19 = pCVar17->cached_bytes;
    pCVar16 = pCVar14;
    if (((uVar12 != uVar19) && (uVar13 = pCVar20->cached_bytes, pCVar16 = pCVar20, uVar13 != uVar12)
        ) && (uVar13 != uVar19)) {
      if (uVar12 < uVar19) {
        if (uVar12 < uVar13) {
          pCVar14 = pCVar20;
        }
        pCVar16 = pCVar14;
        if (uVar19 < uVar13) {
          pCVar16 = pCVar17;
        }
      }
      else {
        if (uVar12 < uVar13) {
          pCVar20 = pCVar14;
        }
        pCVar16 = pCVar20;
        if (uVar13 < uVar19) {
          pCVar16 = pCVar17;
        }
      }
    }
    uVar29 = N - 1;
    uVar8 = cache->cached_bytes;
    puVar5 = cache->ptr;
    puVar6 = pCVar16->ptr;
    cache->cached_bytes = pCVar16->cached_bytes;
    cache->ptr = puVar6;
    pCVar16->cached_bytes = uVar8;
    pCVar16->ptr = puVar5;
    uVar19 = cache->cached_bytes;
    uVar18 = 1;
    uVar13 = 1;
    uVar25 = uVar29;
    uVar12 = uVar29;
LAB_001b34c5:
    uVar22 = uVar12;
    if (uVar18 <= uVar25) goto code_r0x001b34ca;
    goto LAB_001b350d;
  }
  pCVar14 = cache;
  if (1 < (long)N) {
    do {
      puVar5 = pCVar14[1].ptr;
      for (pCVar16 = pCVar14 + 1; cache < pCVar16; pCVar16 = pCVar16 + -1) {
        puVar6 = pCVar16[-1].ptr;
        bVar21 = puVar6[depth];
        bVar23 = puVar5[depth];
        if ((bVar21 != 0) && (lVar15 = lVar27, bVar21 == bVar23)) {
          do {
            bVar21 = puVar6[lVar15];
            bVar23 = puVar5[lVar15];
            if (bVar21 == 0) break;
            lVar15 = lVar15 + 1;
          } while (bVar21 == bVar23);
        }
        if (bVar21 <= bVar23) break;
        pCVar16->ptr = puVar6;
      }
      iVar7 = (int)N;
      pCVar16->ptr = puVar5;
      N = (size_t)(iVar7 - 1);
      pCVar14 = pCVar14 + 1;
    } while (2 < iVar7);
  }
  return;
code_r0x001b34ca:
  pCVar14 = cache + uVar18;
  uVar4 = cache[uVar18].cached_bytes;
  uVar28 = uVar13;
  if (uVar19 > uVar4 || uVar4 == uVar19) {
    if (uVar19 <= uVar4) {
      uVar28 = uVar13 + 1;
      uVar8 = cache[uVar13].cached_bytes;
      puVar5 = cache[uVar13].ptr;
      puVar6 = pCVar14->ptr;
      cache[uVar13].cached_bytes = pCVar14->cached_bytes;
      cache[uVar13].ptr = puVar6;
      pCVar14->cached_bytes = uVar8;
      pCVar14->ptr = puVar5;
    }
    uVar18 = uVar18 + 1;
  }
  uVar13 = uVar28;
  if (uVar4 <= uVar19) goto LAB_001b34c5;
LAB_001b350d:
  do {
    uVar12 = uVar22;
    if (uVar25 < uVar18) break;
    pCVar14 = cache + uVar25;
    uVar28 = cache[uVar25].cached_bytes;
    if (uVar19 <= uVar28) {
      if (uVar28 == uVar19) {
        uVar12 = uVar22 - 1;
        uVar8 = cache[uVar22].cached_bytes;
        puVar5 = cache[uVar22].ptr;
        puVar6 = pCVar14->ptr;
        cache[uVar22].cached_bytes = pCVar14->cached_bytes;
        cache[uVar22].ptr = puVar6;
        pCVar14->cached_bytes = uVar8;
        pCVar14->ptr = puVar5;
      }
      uVar25 = uVar25 - 1;
    }
    uVar22 = uVar12;
  } while (uVar19 <= uVar28);
  if (uVar18 <= uVar25) {
    uVar8 = cache[uVar18].cached_bytes;
    puVar5 = cache[uVar18].ptr;
    puVar6 = cache[uVar25].ptr;
    cache[uVar18].cached_bytes = cache[uVar25].cached_bytes;
    cache[uVar18].ptr = puVar6;
    cache[uVar25].cached_bytes = uVar8;
    cache[uVar25].ptr = puVar5;
    uVar18 = uVar18 + 1;
    uVar25 = uVar25 - 1;
    goto LAB_001b34c5;
  }
  uVar28 = uVar18 - uVar13;
  uVar22 = uVar13;
  if (uVar28 < uVar13) {
    uVar22 = uVar28;
  }
  if (uVar22 != 0) {
    lVar15 = 0;
    do {
      puVar2 = (undefined8 *)((long)&cache->cached_bytes + lVar15);
      uVar9 = *puVar2;
      uVar10 = puVar2[1];
      puVar2 = (undefined8 *)((long)&cache[uVar18 - uVar22].cached_bytes + lVar15);
      uVar11 = puVar2[1];
      puVar3 = (undefined8 *)((long)&cache->cached_bytes + lVar15);
      *puVar3 = *puVar2;
      puVar3[1] = uVar11;
      puVar2 = (undefined8 *)((long)&cache[uVar18 - uVar22].cached_bytes + lVar15);
      *puVar2 = uVar9;
      puVar2[1] = uVar10;
      lVar15 = lVar15 + 0x10;
    } while (uVar22 * 0x10 != lVar15);
  }
  uVar29 = uVar29 - uVar12;
  uVar12 = uVar12 - uVar25;
  uVar25 = uVar29;
  if (uVar12 < uVar29) {
    uVar25 = uVar12;
  }
  if (uVar25 != 0) {
    lVar15 = 0;
    do {
      puVar2 = (undefined8 *)((long)&cache[uVar18].cached_bytes + lVar15);
      uVar9 = *puVar2;
      uVar10 = puVar2[1];
      puVar2 = (undefined8 *)((long)&cache[N - uVar25].cached_bytes + lVar15);
      uVar11 = puVar2[1];
      puVar3 = (undefined8 *)((long)&cache[uVar18].cached_bytes + lVar15);
      *puVar3 = *puVar2;
      puVar3[1] = uVar11;
      puVar2 = (undefined8 *)((long)&cache[N - uVar25].cached_bytes + lVar15);
      *puVar2 = uVar9;
      puVar2[1] = uVar10;
      lVar15 = lVar15 + 0x10;
    } while (uVar25 * 0x10 != lVar15);
  }
  N = uVar29 + uVar13;
  multikey_cache<8u,false>(cache,uVar28,depth);
  cache = cache + uVar28;
  multikey_cache<8u,false>(cache + N,uVar12,depth);
  if ((char)uVar19 == '\0') {
    return;
  }
  depth = depth + 8;
  lVar27 = lVar27 + 8;
  goto LAB_001b32ce;
}

Assistant:

static void
multikey_cache(Cacheblock<CachedChars>* cache, size_t N, size_t depth)
{
	if (N < 32) {
		if (N==0) return;
		if (CacheDirty) {
			insertion_sort(cache, N, depth);
			return;
		}
		inssort_cache_block(cache, N);
		size_t start=0, cnt=1;
		for (size_t i=0; i < N-1; ++i) {
			if (Cmp()(cache[i], cache[i+1]) == 0) {
				++cnt;
				continue;
			}
			if (cnt > 1 and cache[start].cached_bytes & 0xFF)
				insertion_sort(cache+start, cnt,
						depth+CachedChars);
			cnt = 1;
			start = i+1;
		}
		if (cnt > 1 and cache[start].cached_bytes & 0xFF)
			insertion_sort(cache+start, cnt, depth+CachedChars);
		return;
	}
	if (CacheDirty) {
		fill_cache(cache, N, depth);
	}
	// Move pivot to first position to avoid wrapping the unsigned values
	// we are using in the main loop from zero to max.
	std::swap(cache[0], med3char(
		med3char(cache[0],       cache[N/8],     cache[N/4],    Cmp()),
		med3char(cache[N/2-N/8], cache[N/2],     cache[N/2+N/8],Cmp()),
		med3char(cache[N-1-N/4], cache[N-1-N/8], cache[N-3],    Cmp()),
		Cmp()));
	Cacheblock<CachedChars> partval = cache[0];
	size_t first   = 1;
	size_t last    = N-1;
	size_t beg_ins = 1;
	size_t end_ins = N-1;
	while (true) {
		while (first <= last) {
			const int res = Cmp()(cache[first], partval);
			if (res > 0) {
				break;
			} else if (res == 0) {
				std::swap(cache[beg_ins++], cache[first]);
			}
			++first;
		}
		while (first <= last) {
			const int res = Cmp()(cache[last], partval);
			if (res < 0) {
				break;
			} else if (res == 0) {
				std::swap(cache[end_ins--], cache[last]);
			}
			--last;
		}
		if (first > last)
			break;
		std::swap(cache[first], cache[last]);
		++first;
		--last;
	}
	// Some calculations to make the code more readable.
	const size_t num_eq_beg = beg_ins;
	const size_t num_eq_end = N-1-end_ins;
	const size_t num_eq     = num_eq_beg+num_eq_end;
	const size_t num_lt     = first-beg_ins;
	const size_t num_gt     = end_ins-last;
	// Swap the equal pointers from the beginning to proper position.
	const size_t size1 = std::min(num_eq_beg, num_lt);
	std::swap_ranges(cache, cache+size1, cache+first-size1);
	// Swap the equal pointers from the end to proper position.
	const size_t size2 = std::min(num_eq_end, num_gt);
	std::swap_ranges(cache+first, cache+first+size2, cache+N-size2);
	// Now recurse.
	multikey_cache<CachedChars, false>(cache, num_lt, depth);
	multikey_cache<CachedChars, false>(cache+num_lt+num_eq, num_gt, depth);
	if (partval.cached_bytes & 0xFF)
		multikey_cache<CachedChars, true>(
			cache+num_lt, num_eq, depth+CachedChars);
}